

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FCommandBuffer::Draw(FCommandBuffer *this,int x,int y,int scale,bool cursor)

{
  uint uVar1;
  uint uVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  int iVar5;
  int iVar6;
  
  if (scale == 1) {
    DCanvas::DrawChar((DCanvas *)screen,ConFont,8,x,y,'\x1c',0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,8,iVar5 + x,y,(this->Text).Chars + this->StartPos,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    if (cursor) {
      iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
      uVar1 = this->CursorPos;
      uVar2 = this->StartPos;
      iVar6 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
      DCanvas::DrawChar((DCanvas *)pDVar4,pFVar3,10,(uVar1 - uVar2) * iVar6 + x + iVar5,y,'\v',0);
    }
  }
  else {
    DCanvas::DrawChar((DCanvas *)screen,ConFont,8,x,y,'\x1c',0x40001399,
                      (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)scale &
                      0xffffffff,0x4000139a,
                      (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)scale &
                      0xffffffff,0x400013a8,1,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,8,iVar5 + x,y,(this->Text).Chars + this->StartPos,
                      0x40001399,
                      (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)scale &
                      0xffffffff,0x4000139a,
                      (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)scale &
                      0xffffffff,0x400013a8,1,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    if (cursor) {
      iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
      uVar1 = this->CursorPos;
      uVar2 = this->StartPos;
      iVar6 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
      DCanvas::DrawChar((DCanvas *)pDVar4,pFVar3,10,(uVar1 - uVar2) * iVar6 + x + iVar5,y,'\v',
                        0x40001399,
                        (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)scale &
                        0xffffffff,0x4000139a,
                        (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)scale &
                        0xffffffff,0x400013a8,1,0);
    }
  }
  return;
}

Assistant:

void Draw(int x, int y, int scale, bool cursor)
	{
		if (scale == 1)
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c', TAG_DONE);
			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos], TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb', TAG_DONE);
			}
		}
		else
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c',
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos],
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb',
					DTA_VirtualWidth, screen->GetWidth() / scale,
					DTA_VirtualHeight, screen->GetHeight() / scale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}